

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O0

bool doubleComma(char **p)

{
  char **p_local;
  
  SkipBlanks(p);
  if ((**p == ',') && ((*p)[1] == ',')) {
    *p = *p + 2;
    p_local._7_1_ = true;
  }
  else {
    p_local._7_1_ = false;
  }
  return p_local._7_1_;
}

Assistant:

bool doubleComma(char* & p) {
	SkipBlanks(p);
	if (',' != p[0] || ',' != p[1]) return false;
	p += 2;
	return true;
}